

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::FoldRecurrentAddExpressions
          (SENodeSimplifyImpl *this,SENode *root)

{
  pointer ppSVar1;
  _Link_type p_Var2;
  iterator __position;
  void *pvVar3;
  pointer ppVar4;
  int iVar5;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> _Var6;
  undefined4 extraout_var;
  SERecurrentNode *pSVar7;
  vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
  *pvVar8;
  vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
  *extraout_RAX;
  SENode *pSVar9;
  SENode *node_00;
  SENode *pSVar10;
  key_type pLVar11;
  key_type pLVar12;
  long lVar13;
  undefined4 extraout_var_01;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  _Var14;
  undefined4 extraout_var_02;
  _Base_ptr p_Var15;
  _Link_type p_Var16;
  SERecurrentNode *node;
  ScalarEvolutionAnalysis *pSVar17;
  _Link_type p_Var18;
  _Link_type p_Var19;
  uint32_t uVar20;
  pointer ppSVar21;
  pointer ppVar22;
  bool bVar23;
  Loop *loop;
  pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>
  pair;
  key_type local_c0;
  SERecurrentNode *local_b8;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_b0;
  key_type local_a8;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_a0;
  undefined1 local_98 [16];
  pointer local_88;
  long local_80;
  _Rb_tree_node_base *local_78;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_70;
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  local_68;
  undefined4 extraout_var_00;
  
  _Var6._M_head_impl = (SENode *)operator_new(0x30);
  pSVar17 = this->analysis_;
  ((_Var6._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((_Var6._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var6._M_head_impl)->children_).
  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var6._M_head_impl)->parent_analysis_ = pSVar17;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  (_Var6._M_head_impl)->unique_id_ = SENode::NumberOfNodes;
  (_Var6._M_head_impl)->_vptr_SENode = (_func_int **)&PTR_GetType_00939e28;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar21 = (root->children_).
             super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppSVar1 = (root->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppSVar21 != ppSVar1) {
    local_b8 = (SERecurrentNode *)((ulong)local_b8 & 0xffffffff00000000);
    local_b0._M_head_impl = _Var6._M_head_impl;
    local_a8 = (key_type)root;
    do {
      pSVar9 = *ppSVar21;
      iVar5 = (**pSVar9->_vptr_SENode)(pSVar9);
      bVar23 = iVar5 == 4;
      if (bVar23) {
        pSVar9 = *(pSVar9->children_).
                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar5 = (**pSVar9->_vptr_SENode)(pSVar9);
      if (iVar5 == 1) {
        iVar5 = (*pSVar9->_vptr_SENode[6])(pSVar9);
        local_c0 = *(key_type *)(CONCAT44(extraout_var,iVar5) + 0x40);
        iVar5 = (*pSVar9->_vptr_SENode[6])(pSVar9);
        pSVar7 = (SERecurrentNode *)CONCAT44(extraout_var_00,iVar5);
        if ((_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Link_type)0x0) {
          p_Var2 = (_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var19 = (_Link_type)&local_68._M_impl.super__Rb_tree_header;
          do {
            p_Var18 = p_Var19;
            p_Var16 = p_Var2;
            pLVar11 = *(key_type *)(p_Var16->_M_storage)._M_storage;
            p_Var19 = p_Var16;
            if (pLVar11 < local_c0) {
              p_Var19 = p_Var18;
            }
            p_Var2 = (_Link_type)
                     (&(((_Rb_tree_node<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>
                          *)(&p_Var16->_M_storage + -1))->super__Rb_tree_node_base)._M_left)
                     [pLVar11 < local_c0];
          } while (p_Var2 != (_Link_type)0x0);
          if (p_Var19 != (_Link_type)&local_68._M_impl.super__Rb_tree_header) {
            if (pLVar11 < local_c0) {
              p_Var16 = p_Var18;
            }
            if (*(key_type *)(p_Var16->_M_storage)._M_storage <= local_c0) {
              pvVar8 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                        *)std::
                          map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                          ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                        *)&local_68,&local_c0);
              __position._M_current = *(pair<spvtools::opt::SERecurrentNode_*,_bool> **)(pvVar8 + 8)
              ;
              if (__position._M_current ==
                  *(pair<spvtools::opt::SERecurrentNode_*,_bool> **)(pvVar8 + 0x10)) {
                local_98._0_8_ = pSVar7;
                local_98[8] = bVar23;
                std::
                vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                ::_M_realloc_insert<std::pair<spvtools::opt::SERecurrentNode*,bool>>
                          (pvVar8,__position,
                           (pair<spvtools::opt::SERecurrentNode_*,_bool> *)local_98);
                pvVar8 = extraout_RAX;
              }
              else {
                (__position._M_current)->first = pSVar7;
                *(ulong *)&(__position._M_current)->second = CONCAT71(local_98._9_7_,bVar23);
                *(long *)(pvVar8 + 8) = *(long *)(pvVar8 + 8) + 0x10;
                local_98._0_8_ = pSVar7;
                local_98[8] = bVar23;
              }
              local_b8 = (SERecurrentNode *)
                         CONCAT44(local_b8._4_4_,(int)CONCAT71((int7)((ulong)pvVar8 >> 8),1));
              goto LAB_006043ca;
            }
          }
        }
        local_98._0_8_ = pSVar7;
        local_98[8] = bVar23;
        pvVar8 = (vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
                  *)std::
                    map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                    ::operator[]((map<const_spvtools::opt::Loop_*,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
                                  *)&local_68,&local_c0);
        std::
        vector<std::pair<spvtools::opt::SERecurrentNode*,bool>,std::allocator<std::pair<spvtools::opt::SERecurrentNode*,bool>>>
        ::_M_assign_aux<std::pair<spvtools::opt::SERecurrentNode*,bool>const*>
                  (pvVar8,local_98,&local_88);
      }
      else {
        (*(local_b0._M_head_impl)->_vptr_SENode[3])(local_b0._M_head_impl,pSVar9);
      }
LAB_006043ca:
      ppSVar21 = ppSVar21 + 1;
    } while (ppSVar21 != ppSVar1);
    _Var6._M_head_impl = local_b0._M_head_impl;
    root = (SENode *)local_a8;
    if (((ulong)local_b8 & 1) != 0) {
      p_Var15 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_68._M_impl.super__Rb_tree_header) {
        do {
          local_98._0_8_ = *(undefined8 *)(p_Var15 + 1);
          local_78 = p_Var15;
          std::
          vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
          ::vector((vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                    *)(local_98 + 8),
                   (vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>
                    *)&p_Var15[1]._M_parent);
          local_b8 = (SERecurrentNode *)local_98._0_8_;
          pSVar9 = (SENode *)operator_new(0x30);
          pSVar17 = this->analysis_;
          (pSVar9->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pSVar9->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pSVar9->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pSVar9->parent_analysis_ = pSVar17;
          uVar20 = SENode::NumberOfNodes;
          pSVar9->unique_id_ = SENode::NumberOfNodes + 1;
          pSVar9->_vptr_SENode = (_func_int **)&PTR_GetType_00939e28;
          node_00 = (SENode *)operator_new(0x30);
          ppVar4 = local_88;
          (node_00->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (node_00->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (node_00->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          node_00->parent_analysis_ = pSVar17;
          uVar20 = uVar20 + 2;
          SENode::NumberOfNodes = uVar20;
          node_00->unique_id_ = uVar20;
          node_00->_vptr_SENode = (_func_int **)&PTR_GetType_00939e28;
          ppVar22 = (pointer)CONCAT71(local_98._9_7_,local_98[8]);
          if (ppVar22 != local_88) {
            do {
              pSVar7 = ppVar22->first;
              if ((ppVar22->second & 1U) == 0) {
                (*pSVar9->_vptr_SENode[3])(pSVar9,pSVar7->coefficient_);
                pSVar10 = pSVar7->offset_;
              }
              else {
                pSVar10 = ScalarEvolutionAnalysis::CreateNegation
                                    (this->analysis_,pSVar7->coefficient_);
                (*pSVar9->_vptr_SENode[3])(pSVar9,pSVar10);
                pSVar10 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,pSVar7->offset_);
              }
              (*node_00->_vptr_SENode[3])(node_00,pSVar10);
              ppVar22 = ppVar22 + 1;
            } while (ppVar22 != ppVar4);
            pSVar17 = this->analysis_;
            uVar20 = SENode::NumberOfNodes;
          }
          pSVar10 = (SENode *)operator_new(0x48);
          (pSVar10->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pSVar10->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pSVar10->children_).
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pSVar10->parent_analysis_ = pSVar17;
          SENode::NumberOfNodes = uVar20 + 1;
          pSVar10->unique_id_ = SENode::NumberOfNodes;
          pSVar10->_vptr_SENode = (_func_int **)&PTR_GetType_00939cb8;
          pSVar10[1].children_.
          super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8;
          pLVar11 = (key_type)ScalarEvolutionAnalysis::SimplifyExpression(pSVar17,pSVar9);
          pLVar12 = (key_type)ScalarEvolutionAnalysis::SimplifyExpression(this->analysis_,node_00);
          iVar5 = (*(code *)pLVar11->context_->syntax_context_)(pLVar11);
          if ((iVar5 == 0) &&
             (lVar13 = (*(code *)(pLVar11->context_->grammar_).extInstTable_)(pLVar11),
             *(long *)(lVar13 + 0x30) == 0)) {
            (*pSVar10->_vptr_SENode[2])(pSVar10);
            bVar23 = false;
            _Var6._M_head_impl = local_b0._M_head_impl;
            local_a8 = pLVar12;
          }
          else {
            pSVar10[1]._vptr_SENode = (_func_int **)pLVar11;
            local_c0 = pLVar11;
            iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10);
            if (CONCAT44(extraout_var_01,iVar5) != 0) {
LAB_00604798:
              __assert_fail("false && \"Trying to add a child node to a constant!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_analysis_nodes.h"
                            ,0x43,"virtual void spvtools::opt::SENode::AddChild(SENode *)");
            }
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                               ((pSVar10->children_).
                                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (pSVar10->children_).
                                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,pLVar11);
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                      (&pSVar10->children_,(const_iterator)_Var14._M_current,(value_type *)&local_c0
                      );
            pSVar10[1].children_.
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar12;
            local_c0 = pLVar12;
            iVar5 = (*pSVar10->_vptr_SENode[4])(pSVar10);
            if (CONCAT44(extraout_var_02,iVar5) != 0) goto LAB_00604798;
            _Var14 = std::
                     __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                               ((pSVar10->children_).
                                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (pSVar10->children_).
                                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish,pLVar12);
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
                      (&pSVar10->children_,(const_iterator)_Var14._M_current,(value_type *)&local_c0
                      );
            local_a0._M_head_impl = pSVar10;
            pSVar10 = ScalarEvolutionAnalysis::GetCachedOrAdd
                                (this->analysis_,
                                 (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                  *)&local_a0);
            _Var6._M_head_impl = local_b0._M_head_impl;
            (*(local_b0._M_head_impl)->_vptr_SENode[3])(local_b0._M_head_impl,pSVar10);
            if (local_a0._M_head_impl != (SENode *)0x0) {
              (*(local_a0._M_head_impl)->_vptr_SENode[2])();
            }
            local_a0._M_head_impl = (SENode *)0x0;
            bVar23 = true;
          }
          (*node_00->_vptr_SENode[2])(node_00);
          (*pSVar9->_vptr_SENode[2])(pSVar9);
          pvVar3 = (void *)CONCAT71(local_98._9_7_,local_98[8]);
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,local_80 - (long)pvVar3);
          }
          root = (SENode *)local_a8;
          if (!bVar23) goto LAB_0060476b;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(local_78);
        } while ((_Rb_tree_header *)p_Var15 != &local_68._M_impl.super__Rb_tree_header);
      }
      ppSVar21 = ((_Var6._M_head_impl)->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((long)((_Var6._M_head_impl)->children_).
                super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar21 != 8) {
        local_70._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             _Var6._M_head_impl;
        pSVar9 = ScalarEvolutionAnalysis::GetCachedOrAdd
                           (this->analysis_,
                            (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                             *)&local_70);
        if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
            local_70._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
          (**(code **)(*(long *)local_70._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                                .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl
                      + 0x10))();
        }
        local_70._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
             (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
             (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
             )0x0;
        std::
        _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
        ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
        return pSVar9;
      }
      root = *ppSVar21;
    }
  }
LAB_0060476b:
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_std::vector<std::pair<spvtools::opt::SERecurrentNode_*,_bool>,_std::allocator<std::pair<spvtools::opt::SERecurrentNode_*,_bool>_>_>_>_>_>
  ::_M_erase(&local_68,(_Link_type)local_68._M_impl.super__Rb_tree_header._M_header._M_parent);
  (**(code **)(*(long *)_Var6._M_head_impl + 0x10))(_Var6._M_head_impl);
  return (SENode *)(key_type)root;
}

Assistant:

SENode* SENodeSimplifyImpl::FoldRecurrentAddExpressions(SENode* root) {
  std::unique_ptr<SEAddNode> new_node{new SEAddNode(&analysis_)};

  // A mapping of loops to the list of recurrent expressions which are with
  // respect to those loops.
  std::map<const Loop*, std::vector<std::pair<SERecurrentNode*, bool>>>
      loops_to_recurrent{};

  bool has_multiple_same_loop_recurrent_terms = false;

  for (SENode* child : *root) {
    bool negation = false;

    if (child->GetType() == SENode::Negative) {
      child = child->GetChild(0);
      negation = true;
    }

    if (child->GetType() == SENode::RecurrentAddExpr) {
      const Loop* loop = child->AsSERecurrentNode()->GetLoop();

      SERecurrentNode* rec = child->AsSERecurrentNode();
      if (loops_to_recurrent.find(loop) == loops_to_recurrent.end()) {
        loops_to_recurrent[loop] = {std::make_pair(rec, negation)};
      } else {
        loops_to_recurrent[loop].push_back(std::make_pair(rec, negation));
        has_multiple_same_loop_recurrent_terms = true;
      }
    } else {
      new_node->AddChild(child);
    }
  }

  if (!has_multiple_same_loop_recurrent_terms) return root;

  for (auto pair : loops_to_recurrent) {
    std::vector<std::pair<SERecurrentNode*, bool>>& recurrent_expressions =
        pair.second;
    const Loop* loop = pair.first;

    std::unique_ptr<SENode> new_coefficient{new SEAddNode(&analysis_)};
    std::unique_ptr<SENode> new_offset{new SEAddNode(&analysis_)};

    for (auto node_pair : recurrent_expressions) {
      SERecurrentNode* node = node_pair.first;
      bool negative = node_pair.second;

      if (!negative) {
        new_coefficient->AddChild(node->GetCoefficient());
        new_offset->AddChild(node->GetOffset());
      } else {
        new_coefficient->AddChild(
            analysis_.CreateNegation(node->GetCoefficient()));
        new_offset->AddChild(analysis_.CreateNegation(node->GetOffset()));
      }
    }

    std::unique_ptr<SERecurrentNode> new_recurrent{
        new SERecurrentNode(&analysis_, loop)};

    SENode* new_coefficient_simplified =
        analysis_.SimplifyExpression(new_coefficient.get());

    SENode* new_offset_simplified =
        analysis_.SimplifyExpression(new_offset.get());

    if (new_coefficient_simplified->GetType() == SENode::Constant &&
        new_coefficient_simplified->AsSEConstantNode()->FoldToSingleValue() ==
            0) {
      return new_offset_simplified;
    }

    new_recurrent->AddCoefficient(new_coefficient_simplified);
    new_recurrent->AddOffset(new_offset_simplified);

    new_node->AddChild(analysis_.GetCachedOrAdd(std::move(new_recurrent)));
  }

  // If we only have one child in the add just return that.
  if (new_node->GetChildren().size() == 1) {
    return new_node->GetChild(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_node));
}